

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O3

void __thiscall
glslang::TParseVersions::int16ScalarVectorCheck
          (TParseVersions *this,TSourceLoc *loc,char *op,bool builtIn)

{
  undefined7 in_register_00000009;
  char *extensions [4];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  char *local_18;
  char *pcStack_10;
  
  if ((int)CONCAT71(in_register_00000009,builtIn) == 0) {
    local_18 = "GL_EXT_shader_explicit_arithmetic_types";
    pcStack_10 = "GL_EXT_shader_explicit_arithmetic_types_int16";
    local_28 = 0x6eaddf;
    uStack_24 = 0;
    uStack_20 = 0x6eabb4;
    uStack_1c = 0;
    (*this->_vptr_TParseVersions[5])(this,loc,4,&local_28,op);
  }
  return;
}

Assistant:

void TParseVersions::int16ScalarVectorCheck(const TSourceLoc& loc, const char* op, bool builtIn)
{
    if (! builtIn) {
    	const char* const extensions[] = {
                                           E_GL_AMD_gpu_shader_int16,
                                           E_GL_EXT_shader_16bit_storage,
                                           E_GL_EXT_shader_explicit_arithmetic_types,
                                           E_GL_EXT_shader_explicit_arithmetic_types_int16};
        requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, op);
    }
}